

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_common.cc
# Opt level: O1

void YUY2ToUVRow_C(uint8_t *src_yuy2,int src_stride_yuy2,uint8_t *dst_u,uint8_t *dst_v,int width)

{
  long lVar1;
  int iVar2;
  
  if (0 < width) {
    lVar1 = 0;
    iVar2 = 0;
    do {
      dst_u[lVar1] = (uint8_t)((uint)src_yuy2[lVar1 * 4 + 1] +
                               (uint)src_yuy2[lVar1 * 4 + (long)src_stride_yuy2 + 1] + 1 >> 1);
      dst_v[lVar1] = (uint8_t)((uint)src_yuy2[lVar1 * 4 + 3] +
                               (uint)src_yuy2[lVar1 * 4 + (long)src_stride_yuy2 + 3] + 1 >> 1);
      iVar2 = iVar2 + 2;
      lVar1 = lVar1 + 1;
    } while (iVar2 < width);
  }
  return;
}

Assistant:

void YUY2ToUVRow_C(const uint8_t* src_yuy2,
                   int src_stride_yuy2,
                   uint8_t* dst_u,
                   uint8_t* dst_v,
                   int width) {
  // Output a row of UV values, filtering 2 rows of YUY2.
  int x;
  for (x = 0; x < width; x += 2) {
    dst_u[0] = (src_yuy2[1] + src_yuy2[src_stride_yuy2 + 1] + 1) >> 1;
    dst_v[0] = (src_yuy2[3] + src_yuy2[src_stride_yuy2 + 3] + 1) >> 1;
    src_yuy2 += 4;
    dst_u += 1;
    dst_v += 1;
  }
}